

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

void __thiscall cs::exception::relocate_to_csym(exception *this,csym_info *csym)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  string *str;
  long in_RSI;
  long in_RDI;
  string *in_stack_00000030;
  string *in_stack_00000038;
  size_t in_stack_00000040;
  string *in_stack_00000048;
  string *relocated_code;
  size_t relocated_line;
  string *in_stack_ffffffffffffff08;
  fatal_error *in_stack_ffffffffffffff10;
  fatal_error *this_00;
  string local_c0 [32];
  string local_a0 [32];
  const_reference local_80;
  undefined1 local_72;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  uVar1 = *(ulong *)(in_RDI + 8);
  local_10 = in_RSI;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x20));
  if (sVar2 <= uVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Invalid line when relocating symbols in cSYM.",&local_31)
    ;
    fatal_error::fatal_error(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 + 0x20),
                      *(long *)(in_RDI + 8) - 1);
  uVar1 = *pvVar4;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_10 + 0x38));
  if (sVar2 <= uVar1) {
    local_72 = 1;
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (fatal_error *)&stack0xffffffffffffff8f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff90,"Broken cSYM file.",(allocator *)this_00);
    fatal_error::fatal_error(this_00,str);
    local_72 = 0;
    __cxa_throw(str,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (uVar1 == 0) {
    compose_what_internal(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x70),local_c0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    local_80 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_10 + 0x38),uVar1 - 1);
    compose_what(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x70),local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  return;
}

Assistant:

void exception::relocate_to_csym(const csym_info &csym)
	{
		if (mLine >= csym.map.size())
			throw fatal_error("Invalid line when relocating symbols in cSYM.");
		std::size_t relocated_line = csym.map[mLine - 1];
		if (relocated_line >= csym.codes.size())
			throw fatal_error("Broken cSYM file.");
		if (relocated_line > 0) {
			const std::string &relocated_code = csym.codes[relocated_line - 1];
			mStr = compose_what(csym.file, relocated_line, relocated_code, mWhat);
		}
		else
			mStr = compose_what_internal(csym.file, mWhat);
	}